

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O3

bool __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
_solve<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *B,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *X_base)

{
  ulong nbRows;
  ulong nbCols;
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  MappedSuperNodalMatrix<double,int> *pMVar4;
  MappedSuperNodalMatrix<double,int> *pMVar5;
  long lVar6;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_90;
  MappedSuperNodalMatrix<double,int> *local_68;
  MappedSuperNodalMatrix<double,int> *local_60;
  long local_58;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_48;
  long local_40;
  MappedSuperNodalMatrix<double,int> *local_38;
  
  local_38 = (MappedSuperNodalMatrix<double,int> *)this;
  if (this[5] == (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>)0x0) {
    __assert_fail("m_factorizationIsOk && \"The matrix should be factorized first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0xe1,
                  "bool Eigen::SparseLU<Eigen::SparseMatrix<double>>::_solve(const MatrixBase<Rhs> &, MatrixBase<Dest> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>, Dest = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  nbRows = *(ulong *)(B + 8);
  nbCols = *(ulong *)(B + 0x10);
  if ((long)(nbCols | nbRows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((nbCols != 0 && nbRows != 0) &&
     (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar2 / SEXT816((long)nbCols),0) < (long)nbRows)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8,B,SUB168(auVar2 % SEXT816((long)nbCols),0));
    *puVar3 = std::streambuf::xsgetn;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)X_base,nbCols * nbRows,nbRows,nbCols);
  if (0 < *(long *)(B + 0x10)) {
    pMVar5 = local_38 + 0xe0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(B + 8);
      pMVar4 = (MappedSuperNodalMatrix<double,int> *)(lVar1 * lVar6 * 8 + *(long *)B);
      if (lVar1 < 0 && pMVar4 != (MappedSuperNodalMatrix<double,int> *)0x0) goto LAB_00165efc;
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = *(long *)(X_base + 8);
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)
           (local_90.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
            m_rows.m_value * lVar6 * 8 + *(long *)X_base);
      local_68 = pMVar5;
      local_60 = pMVar4;
      local_58 = lVar1;
      local_48 = B;
      local_40 = lVar1;
      if (local_90.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value < 0 &&
          (MappedSuperNodalMatrix<double,int> *)
          local_90.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_data != (MappedSuperNodalMatrix<double,int> *)0x0) goto LAB_00165efc;
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (Nested)X_base;
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride =
           local_90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
      if (*(long *)(X_base + 0x10) <= lVar6) goto LAB_00165f1b;
      internal::
      permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,false>
      ::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,false>
                  *)&local_68,&local_90);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(long *)(B + 0x10));
  }
  pMVar4 = local_38;
  pMVar5 = local_38 + 0x68;
  internal::MappedSuperNodalMatrix<double,int>::solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (pMVar5,X_base);
  local_60 = pMVar4 + 0xa8;
  local_68 = pMVar5;
  SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
  ::solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
              *)&local_68,X_base);
  if (0 < *(long *)(B + 0x10)) {
    local_38 = local_38 + 0xd0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(X_base + 8);
      pMVar5 = (MappedSuperNodalMatrix<double,int> *)(lVar1 * lVar6 * 8 + *(long *)X_base);
      if (lVar1 < 0 && pMVar5 != (MappedSuperNodalMatrix<double,int> *)0x0) {
LAB_00165efc:
        __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                      ,0x94,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if (*(long *)(X_base + 0x10) <= lVar6) {
LAB_00165f1b:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                      ,0x76,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      local_68 = local_38;
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)pMVar5;
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = lVar1;
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (Nested)X_base;
      local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = lVar1;
      local_60 = pMVar5;
      local_58 = lVar1;
      local_48 = X_base;
      local_40 = lVar1;
      internal::
      permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,true>
      ::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,true>
                  *)&local_68,&local_90);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(long *)(B + 0x10));
  }
  return true;
}

Assistant:

bool _solve(const MatrixBase<Rhs> &B, MatrixBase<Dest> &X_base) const
    {
      Dest& X(X_base.derived());
      eigen_assert(m_factorizationIsOk && "The matrix should be factorized first");
      EIGEN_STATIC_ASSERT((Dest::Flags&RowMajorBit)==0,
                        THIS_METHOD_IS_ONLY_FOR_COLUMN_MAJOR_MATRICES);
      
      // Permute the right hand side to form X = Pr*B
      // on return, X is overwritten by the computed solution
      X.resize(B.rows(),B.cols());

      // this ugly const_cast_derived() helps to detect aliasing when applying the permutations
      for(Index j = 0; j < B.cols(); ++j)
        X.col(j) = rowsPermutation() * B.const_cast_derived().col(j);
      
      //Forward substitution with L
      this->matrixL().solveInPlace(X);
      this->matrixU().solveInPlace(X);
      
      // Permute back the solution 
      for (Index j = 0; j < B.cols(); ++j)
        X.col(j) = colsPermutation().inverse() * X.col(j);
      
      return true; 
    }